

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::pair<cs_impl::any,_cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<cs_impl::any,cs_impl::any>
          (allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           *this,any *args,any *args_1)

{
  long lVar1;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *phVar2;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<std::pair<cs_impl::any,_cs_impl::any>_> *)operator_new(0x18);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar2 = *(holder<std::pair<cs_impl::any,_cs_impl::any>_> **)(this + lVar1 * 8 + -8);
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0023b608;
  (phVar2->mDat).first.mDat = (proxy *)0x0;
  (phVar2->mDat).first.mDat = args->mDat;
  args->mDat = (proxy *)0x0;
  (phVar2->mDat).second.mDat = (proxy *)0x0;
  (phVar2->mDat).second.mDat = args_1->mDat;
  args_1->mDat = (proxy *)0x0;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}